

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O3

void __thiscall
asio::detail::
wait_handler<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_asio::any_io_executor>
::wait_handler(wait_handler<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_asio::any_io_executor>
               *this,io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>
                     *h,any_io_executor *io_ex)

{
  error_category *peVar1;
  
  (this->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
  (this->super_wait_op).super_operation.func_ = do_complete;
  (this->super_wait_op).super_operation.task_result_ = 0;
  (this->super_wait_op).ec_._M_value = 0;
  peVar1 = (error_category *)std::_V2::system_category();
  (this->super_wait_op).ec_._M_cat = peVar1;
  (this->super_wait_op).cancellation_key_ = (void *)0x0;
  ssl::detail::
  io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>
  ::io_op(&this->handler_,h);
  handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
  handler_work_base(&(this->work_).
                     super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                    ,0,0,io_ex);
  return;
}

Assistant:

wait_handler(Handler& h, const IoExecutor& io_ex)
    : wait_op(&wait_handler::do_complete),
      handler_(ASIO_MOVE_CAST(Handler)(h)),
      work_(handler_, io_ex)
  {
  }